

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O2

void __thiscall spdlog::details::backtracer::push_back(backtracer *this,log_msg *msg)

{
  log_msg_buffer lStack_1a8;
  
  std::mutex::lock(&this->mutex_);
  log_msg_buffer::log_msg_buffer(&lStack_1a8,msg);
  circular_q<spdlog::details::log_msg_buffer>::push_back(&this->messages_,&lStack_1a8);
  log_msg_buffer::~log_msg_buffer(&lStack_1a8);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void backtracer::push_back(const log_msg &msg)
{
    std::lock_guard<std::mutex> lock{mutex_};
    messages_.push_back(log_msg_buffer{msg});
}